

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QShape.cpp
# Opt level: O0

void __thiscall QShapePrivate::~QShapePrivate(QShapePrivate *this)

{
  QObject *in_RDI;
  
  *(undefined ***)in_RDI = &PTR_metaObject_0026ac40;
  QPainterPath::~QPainterPath((QPainterPath *)(in_RDI + 0x58));
  QPainterPath::~QPainterPath((QPainterPath *)(in_RDI + 0x50));
  QPen::~QPen((QPen *)(in_RDI + 0x38));
  QBrush::~QBrush((QBrush *)(in_RDI + 0x30));
  QObject::~QObject(in_RDI);
  return;
}

Assistant:

class QShapePrivate : public QObject {
    Q_OBJECT

public:
    explicit QShapePrivate(QShape *widgetP)
        : QObject(widgetP)
        , widget(widgetP)
        , renderHints(QPainter::TextAntialiasing)
        , margins(QMargins(3, 3, 3, 3))
        , shape(QShape::Shape::Circle)
        , radius(QPoint(6, 6)) {
        Q_ASSERT(widget);
    }

    void updateShape() {
        const QRect contentsRect =
            widget->contentsRect().adjusted(margins.left(), margins.top(), -margins.right(), -margins.bottom());
        const int min = qMin(contentsRect.width(), contentsRect.height());
        QRect area = QRect(QPoint(), contentsRect.size());
        QPainterPath newPath;

        if (static_cast<int>(shape) & QShape::SquaredFlag) {
            area.setWidth(min);
            area.setHeight(min);
        }

        area.moveCenter(contentsRect.center());

        if (pen.style() != Qt::NoPen) {
            const int adjust = pen.isCosmetic() ? 1 : pen.width();
            area.adjust(0, 0, -adjust, -adjust);
        }

        switch (shape) {
        case QShape::Shape::Circle:
        case QShape::Shape::SquaredCircle: {
            newPath.addEllipse(area);
            break;
        }
        case QShape::Shape::Diamond:
        case QShape::Shape::SquaredDiamond: {
            const QPoint center = area.center();
            newPath.addPolygon(QPolygon(QVector<QPoint>()
                                        << QPoint(center.x(), area.top()) << QPoint(area.right(), center.y())
                                        << QPoint(center.x(), area.bottom()) << QPoint(area.left(), center.y())
                                        << QPoint(center.x(), area.top())));
            break;
        }
        case QShape::Shape::Rectangle: {
            newPath.addRect(area);
            break;
        }
        case QShape::Shape::RoundedRectangle: {
            newPath.addRoundedRect(area, radius.x(), radius.y());
            break;
        }
        case QShape::Shape::Square: {
            newPath.addRect(area);
            break;
        }
        case QShape::Shape::RoundedSquare: {
            newPath.addRoundedRect(area, radius.x(), radius.y());
            break;
        }
        case QShape::Shape::Triangle:
        case QShape::Shape::SquaredTriangle: {
            const QPoint center = area.center();
            newPath.addPolygon(QPolygon(QVector<QPoint>() << QPoint(center.x(), area.top()) << area.bottomRight()
                                                          << area.bottomLeft() << QPoint(center.x(), area.top())));
            break;
        }
        case QShape::Shape::User: {
            newPath = userPath;
            break;
        }
        }

        path = newPath;
        widget->update();
    }